

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

void Assimp::IFC::FindLikelyCrossingLines(iterator current)

{
  double *pdVar1;
  ulong *puVar2;
  pointer paVar3;
  pointer paVar4;
  _Bit_type *p_Var5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  paVar3 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar4 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar3 == paVar4) {
    dVar10 = 0.0;
    dVar9 = 0.0;
  }
  else {
    dVar9 = 0.0;
    lVar8 = 0;
    dVar10 = 0.0;
    do {
      if (lVar8 != 0) {
        dVar11 = ABS(*(double *)((long)&paVar3->x + lVar8) - dVar9);
        dVar10 = ABS(*(double *)((long)&paVar3->y + lVar8) - dVar10);
        dVar9 = dVar10;
        if (dVar10 <= dVar11) {
          dVar9 = dVar11;
        }
        if (ABS(dVar11 - dVar10) < dVar9 * 0.8) {
          uVar7 = (lVar8 >> 4) - 1;
          uVar6 = (lVar8 >> 4) + 0x3e;
          if (-1 < (long)uVar7) {
            uVar6 = uVar7;
          }
          puVar2 = ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   ((long)uVar6 >> 6) +
                   (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
          *puVar2 = *puVar2 | 1L << ((byte)uVar7 & 0x3f);
        }
      }
      pdVar1 = (double *)((long)&paVar3->x + lVar8);
      dVar9 = *pdVar1;
      dVar10 = pdVar1[1];
      lVar8 = lVar8 + 0x10;
    } while ((pointer)(pdVar1 + 2) != paVar4);
  }
  dVar11 = ABS(paVar3->x - dVar9);
  dVar10 = ABS(paVar3->y - dVar10);
  dVar9 = dVar10;
  if (dVar10 <= dVar11) {
    dVar9 = dVar11;
  }
  if (ABS(dVar11 - dVar10) < dVar9 * 0.8) {
    p_Var5 = ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar7 = (ulong)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    lVar8 = (long)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)p_Var5;
    uVar6 = (uVar7 + lVar8 * 8) - 1;
    uVar7 = uVar7 + lVar8 * 8 + 0x3e;
    if (-1 < (long)uVar6) {
      uVar7 = uVar6;
    }
    puVar2 = p_Var5 + ((long)uVar7 >> 6) +
                      (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff;
    *puVar2 = *puVar2 | 1L << ((byte)uVar6 & 0x3f);
  }
  return;
}

Assistant:

void FindLikelyCrossingLines(ContourVector::iterator current)
{
    SkipList& skiplist = (*current).skiplist;
    IfcVector2 last_proj_point;

    const Contour::const_iterator cbegin = (*current).contour.begin(), cend = (*current).contour.end();
    for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {
        const IfcVector2& proj_point = *cit;

        if (cit != cbegin) {
            IfcVector2 vdelta = proj_point - last_proj_point;
            if (LikelyDiagonal(vdelta)) {
                skiplist[std::distance(cbegin, cit) - 1] = true;
            }
        }

        last_proj_point = proj_point;
    }

    // handle last segment
    if (LikelyDiagonal(*cbegin - last_proj_point)) {
        skiplist[skiplist.size()-1] = true;
    }
}